

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::CommonVars_abi_cxx11_
          (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Options *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _anonymous_namespace_ _Var3;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraout_RAX;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraout_RAX_00;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraout_RAX_01;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraout_RAX_02;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pfVar4;
  long lVar5;
  AlphaNum *in_R8;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  allocator<char> local_46b;
  allocator_type local_46a;
  key_equal local_469;
  string local_468;
  string local_448;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  *local_428;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  undefined8 local_3f0;
  char *local_3e8;
  char *local_3e0;
  size_type local_3d8;
  char local_3d0 [8];
  undefined8 uStack_3c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_390;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  undefined8 local_1b0;
  char *local_1a8;
  string local_1a0 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  AlphaNum local_f0;
  undefined8 local_c0;
  char *local_b8;
  AlphaNum local_90;
  undefined8 local_60;
  char *local_58;
  
  _Var3 = this[0xca];
  local_60 = 2;
  local_90.piece_._M_len = (size_t)&DAT_00000006;
  if (_Var3 != (_anonymous_namespace_)0x0) {
    local_90.piece_._M_len = 0x10;
  }
  pcVar6 = "proto2";
  local_90.piece_._M_str = "proto2";
  if (_Var3 != (_anonymous_namespace_)0x0) {
    local_90.piece_._M_str = "google::protobuf";
  }
  local_58 = "::";
  local_428 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               *)__return_storage_ptr__;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_448,(lts_20250127 *)&local_60,&local_90,(AlphaNum *)local_90.piece_._M_len);
  local_420.second._M_dataplus._M_p = (pointer)&local_420.second.field_2;
  local_420.first._M_len = 2;
  local_420.first._M_str = "pb";
  paVar1 = &local_448.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p == paVar1) {
    local_420.second.field_2._8_8_ = local_448.field_2._8_8_;
  }
  else {
    local_420.second._M_dataplus._M_p = local_448._M_dataplus._M_p;
  }
  local_420.second._M_string_length = local_448._M_string_length;
  local_448._M_string_length = 0;
  local_448.field_2._M_local_buf[0] = '\0';
  local_c0 = 2;
  local_b8 = "::";
  local_f0.piece_._M_len = 6;
  if (this[0xca] != (_anonymous_namespace_)0x0) {
    local_f0.piece_._M_len = 0x10;
    pcVar6 = "google::protobuf";
  }
  local_120.first._M_len = 10;
  local_120.first._M_str = "::internal";
  local_448._M_dataplus._M_p = (pointer)paVar1;
  local_f0.piece_._M_str = pcVar6;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_468,(lts_20250127 *)&local_c0,&local_f0,(AlphaNum *)&local_120,in_R8);
  local_3e0 = local_3d0;
  local_3f0 = 3;
  local_3e8 = "pbi";
  paVar2 = &local_468.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p == paVar2) {
    uStack_3c8 = local_468.field_2._8_8_;
  }
  else {
    local_3e0 = local_468._M_dataplus._M_p;
  }
  local_3d8 = local_468._M_string_length;
  local_468._M_string_length = 0;
  local_468.field_2._M_local_buf[0] = '\0';
  local_468._M_dataplus._M_p = (pointer)paVar2;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_const_char_(&)[12],_true>
            (&local_3c0,(char (*) [7])0x64c569,(char (*) [12])"std::string");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[9],_true>
            (&local_390,(char (*) [5])0x5171f4,(char (*) [9])"::int8_t");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[10],_true>
            (&local_360,(char (*) [6])0x643d27,(char (*) [10])"::int32_t");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[10],_true>
            (&local_330,(char (*) [6])0x643d2e,(char (*) [10])"::int64_t");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[10],_true>
            (&local_300,(char (*) [6])"uint8",(char (*) [10])"::uint8_t");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_const_char_(&)[11],_true>
            (&local_2d0,(char (*) [7])"uint32",(char (*) [11])"::uint32_t");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_const_char_(&)[11],_true>
            (&local_2a0,(char (*) [7])"uint64",(char (*) [11])"::uint64_t");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[12],_const_char_(&)[],_true>
            (&local_270,(char (*) [12])"hrule_thick",
             "// ===================================================================\n");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[11],_const_char_(&)[],_true>
            (&local_240,(char (*) [11])"hrule_thin",
             "// -------------------------------------------------------------------\n");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_(&)[18],_true>
            (&local_210,(char (*) [9])"nullable",(char (*) [18])"PROTOBUF_NULLABLE");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char_(&)[17],_true>
            (&local_1e0,(char (*) [8])"nonnull",(char (*) [17])"PROTOBUF_NONNULL");
  pcVar6 = "GOOGLE3_PROTOBUF";
  if (_Var3 != (_anonymous_namespace_)0x0) {
    pcVar6 = "GOOGLE_PROTOBUF";
  }
  local_1b0 = 0xf;
  local_1a8 = "GOOGLE_PROTOBUF";
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,pcVar6,&local_46b);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[11],_true>
            (&local_180,(char (*) [4])0x51729f,(char (*) [11])"ABSL_CHECK");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[12],_true>
            (&local_150,(char (*) [5])"DCHK",(char (*) [12])"ABSL_DCHECK");
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::
  raw_hash_set<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>const*>
            (local_428,&local_420,&local_120,0,(hasher *)&local_46b,&local_469,&local_46a);
  lVar5 = -0x300;
  paVar7 = &local_150.second.field_2;
  pfVar4 = extraout_RAX;
  do {
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar7->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1
                     );
      pfVar4 = extraout_RAX_00;
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar7->_M_allocated_capacity + -6);
    lVar5 = lVar5 + 0x30;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != paVar2) {
    operator_delete(local_468._M_dataplus._M_p,
                    CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                             local_468.field_2._M_local_buf[0]) + 1);
    pfVar4 = extraout_RAX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,
                    CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                             local_448.field_2._M_local_buf[0]) + 1);
    pfVar4 = extraout_RAX_02;
  }
  return pfVar4;
}

Assistant:

absl::flat_hash_map<absl::string_view, std::string> CommonVars(
    const Options& options) {
  bool is_oss = options.opensource_runtime;
  return {
      {"pb", absl::StrCat("::", ProtobufNamespace(options))},
      {"pbi", absl::StrCat("::", ProtobufNamespace(options), "::internal")},

      {"string", "std::string"},
      {"int8", "::int8_t"},
      {"int32", "::int32_t"},
      {"int64", "::int64_t"},
      {"uint8", "::uint8_t"},
      {"uint32", "::uint32_t"},
      {"uint64", "::uint64_t"},

      {"hrule_thick", kThickSeparator},
      {"hrule_thin", kThinSeparator},

      {"nullable", "PROTOBUF_NULLABLE"},
      {"nonnull", "PROTOBUF_NONNULL"},

      // Warning: there is some clever naming/splitting here to avoid extract
      // script rewrites.  The names of these variables must not be things that
      // the extract script will rewrite.  That's why we use "CHK" (for example)
      // instead of "ABSL_CHECK".
      //
      // These values are things the extract script would rewrite if we did not
      // split them.  It might not strictly matter since we don't generate
      // google3 code in open-source.  But it's good to prevent surprising
      // things from happening.
      {"GOOGLE_PROTOBUF", is_oss ? "GOOGLE_PROTOBUF"
                                 : "GOOGLE3_PROTOBU"
                                   "F"},
      {"CHK",
       "ABSL_CHEC"
       "K"},
      {"DCHK",
       "ABSL_DCHEC"
       "K"},
  };
}